

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O0

void __thiscall Catch::XmlReporter::sectionStarting(XmlReporter *this,SectionInfo *sectionInfo)

{
  int iVar1;
  XmlFormatting fmt;
  XmlWriter *this_00;
  StringRef local_80;
  StringRef local_70;
  StringRef local_60;
  allocator<char> local_39;
  string local_38;
  SectionInfo *local_18;
  SectionInfo *sectionInfo_local;
  XmlReporter *this_local;
  
  local_18 = sectionInfo;
  sectionInfo_local = (SectionInfo *)this;
  StreamingReporterBase::sectionStarting(&this->super_StreamingReporterBase,sectionInfo);
  iVar1 = this->m_sectionDepth;
  this->m_sectionDepth = iVar1 + 1;
  if (0 < iVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Section",&local_39);
    fmt = operator|(Newline,Indent);
    this_00 = XmlWriter::startElement(&this->m_xml,&local_38,fmt);
    local_60 = operator____sr("name",4);
    StringRef::StringRef(&local_80,&local_18->name);
    local_70 = trim(local_80);
    XmlWriter::writeAttribute(this_00,local_60,local_70);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
    writeSourceInfo(this,&local_18->lineInfo);
    XmlWriter::ensureTagClosed(&this->m_xml);
  }
  return;
}

Assistant:

void XmlReporter::sectionStarting( SectionInfo const& sectionInfo ) {
        StreamingReporterBase::sectionStarting( sectionInfo );
        if( m_sectionDepth++ > 0 ) {
            m_xml.startElement( "Section" )
                .writeAttribute( "name"_sr, trim( StringRef(sectionInfo.name) ) );
            writeSourceInfo( sectionInfo.lineInfo );
            m_xml.ensureTagClosed();
        }
    }